

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

uint32 __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::VBInt>::readFrom
          (Property<Protocol::MQTT::Common::VBInt> *this,uint8 *buffer,uint32 bufLength)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint32 uVar4;
  
  uVar4 = 0xffffffff;
  if (((-1 < (char)*buffer) && (*buffer == (this->super_PropertyBase).type)) &&
     (uVar4 = 0xfffffffe, 1 < bufLength)) {
    (this->value).size = 0;
    do {
      uVar1 = (this->value).size;
      if (bufLength - 1 <= (uint)uVar1) {
        uVar3 = 0xfffffffe;
        goto LAB_00108ad9;
      }
      (this->value).field_0.value[uVar1] = buffer[(ulong)uVar1 + 1];
      uVar1 = (this->value).size;
      uVar2 = uVar1 + 1;
      (this->value).size = uVar2;
      if (-1 < (char)(this->value).field_0.value[uVar1]) {
        uVar3 = (uint)uVar2;
        goto LAB_00108ad9;
      }
    } while (uVar2 != 4);
    uVar3 = 0xffffffff;
LAB_00108ad9:
    uVar4 = uVar3 + (uVar3 < 0xfffffffd);
  }
  return uVar4;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if ((buffer[0] & 0x80) || buffer[0] != type) return BadData;
                    if (bufLength < 2) return NotEnoughData;
                    uint32 o = value.readFrom(buffer+1, bufLength - 1);
                    if (isError(o)) return o;
                    return o+1;
                }